

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O0

char * cram_encode_aux(cram_fd *fd,bam_seq_t *b,cram_container *c,cram_slice *s,cram_record *cr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  size_t sVar3;
  char cVar4;
  undefined4 uVar13;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  uint uVar18;
  void *pvVar19;
  cram_block *pcVar20;
  byte *pbVar21;
  uchar *puVar22;
  char *pcVar23;
  char *pcVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  double local_180;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  double local_160;
  double local_150;
  double local_148;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f0;
  int local_e0;
  uint32_t count_1;
  int blen_1;
  int type_1;
  char *tmp_8;
  char *tmp_7;
  char *tmp_6;
  char *tmp_5;
  int local_b0;
  uint32_t count;
  int blen;
  int type;
  char *tmp_4;
  char *tmp_3;
  char *tmp_2;
  char *tmp_1;
  uint local_80;
  int r;
  uint32_t i32;
  khint_t k;
  char *key;
  int new;
  int TD_blk_size;
  cram_block *td_b;
  char *pcStack_58;
  int aux_size;
  char *rg;
  char *tmp;
  char *orig;
  char *aux;
  cram_record *cr_local;
  cram_slice *s_local;
  cram_container *c_local;
  bam_seq_t *b_local;
  cram_fd *fd_local;
  
  pcStack_58 = (char *)0x0;
  td_b._4_4_ = (((b->l_data +
                 (uint)(ushort)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x30) * -4) -
                ((uint)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x18) & 0xff)) -
               (b->core).l_qseq) - ((b->core).l_qseq + 1 >> 1);
  _new = c->comp_hdr->TD_blk;
  key._4_4_ = (int)_new->byte;
  aux = (char *)cr;
  cr_local = (cram_record *)s;
  s_local = (cram_slice *)c;
  c_local = (cram_container *)b;
  b_local = (bam_seq_t *)fd;
  while( true ) {
    uVar1 = *(undefined8 *)(*(long *)&cr_local[1].apos + 0x28);
    auVar46._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar46._0_8_ = uVar1;
    auVar46._12_4_ = 0x45300000;
    uVar2 = *(undefined8 *)(*(long *)&cr_local[1].apos + 0x30);
    auVar26._8_4_ = (int)((ulong)uVar2 >> 0x20);
    auVar26._0_8_ = uVar2;
    auVar26._12_4_ = 0x45300000;
    if ((auVar26._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0) +
        (double)td_b._4_4_ * 1.34 + 1.0 <
        (auVar46._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) break;
    if (*(long *)(*(long *)&cr_local[1].apos + 0x28) == 0) {
      local_f0 = 1024.0;
    }
    else {
      uVar1 = *(undefined8 *)(*(long *)&cr_local[1].apos + 0x28);
      auVar27._8_4_ = (int)((ulong)uVar1 >> 0x20);
      auVar27._0_8_ = uVar1;
      auVar27._12_4_ = 0x45300000;
      local_f0 = ((auVar27._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
    }
    *(long *)(*(long *)&cr_local[1].apos + 0x28) =
         (long)local_f0 | (long)(local_f0 - 9.223372036854776e+18) & (long)local_f0 >> 0x3f;
    pvVar19 = realloc(*(void **)(*(long *)&cr_local[1].apos + 0x20),
                      *(size_t *)(*(long *)&cr_local[1].apos + 0x28));
    *(void **)(*(long *)&cr_local[1].apos + 0x20) = pvVar19;
  }
  uVar13 = c_local->ref_seq_span;
  uVar1._0_4_ = c_local->ref_seq_start;
  uVar1._4_4_ = c_local->ref_seq_span;
  tmp = (char *)(*(long *)&c_local->num_landmarks +
                 (long)(int)((uint)(ushort)((uint)uVar13 >> 0x10) << 2) +
                 (long)(int)((uint)((ulong)uVar1 >> 0x18) & 0xff) +
                 (long)((int)c_local->record_counter + 1 >> 1) + (long)(int)c_local->record_counter)
  ;
  rg = (char *)(*(long *)(*(long *)&cr_local[1].apos + 0x20) +
               *(long *)(*(long *)&cr_local[1].apos + 0x30));
  orig = tmp;
LAB_00173500:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          bVar25 = false;
          if ((long)orig - (long)tmp < (long)td_b._4_4_) {
            bVar25 = *orig != '\0';
          }
          if (!bVar25) {
            while (_new->alloc <= _new->byte + 1) {
              if (_new->alloc == 0) {
                local_180 = 1024.0;
              }
              else {
                sVar3 = _new->alloc;
                auVar45._8_4_ = (int)(sVar3 >> 0x20);
                auVar45._0_8_ = sVar3;
                auVar45._12_4_ = 0x45300000;
                local_180 = ((auVar45._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) * 1.5;
              }
              _new->alloc = (long)local_180 |
                            (long)(local_180 - 9.223372036854776e+18) & (long)local_180 >> 0x3f;
              puVar22 = (uchar *)realloc(_new->data,_new->alloc);
              _new->data = puVar22;
            }
            sVar3 = _new->byte;
            _new->byte = sVar3 + 1;
            _new->data[sVar3] = '\0';
            _i32 = string_ndup(*(string_alloc_t **)&s_local->features[7].field_0,
                               (char *)(_new->data + key._4_4_),_new->byte - (long)key._4_4_);
            r = kh_put_m_s2i(*(kh_m_s2i_t **)((long)&s_local->features[6].field_0 + 8),_i32,
                             (int *)&key);
            if ((int)key < 0) {
              return (char *)0x0;
            }
            if ((int)key == 0) {
              _new->byte = (long)key._4_4_;
            }
            else {
              *(int *)(*(long *)(*(long *)((long)&s_local->features[6].field_0 + 8) + 0x20) +
                      (ulong)(uint)r * 4) = s_local->features[5].field_0.X.base;
              s_local->features[5].field_0.X.base = s_local->features[5].field_0.X.base + 1;
            }
            *(undefined4 *)(aux + 0x48) =
                 *(undefined4 *)
                  (*(long *)(*(long *)((long)&s_local->features[6].field_0 + 8) + 0x20) +
                  (ulong)(uint)r * 4);
            cram_stats_add((cram_stats *)s_local[1].aux_os_blk,*(int32_t *)(aux + 0x48));
            *(int *)(aux + 0x3c) = (int)*(undefined8 *)(*(long *)&cr_local[1].apos + 0x30);
            *(int *)(aux + 0x40) =
                 (int)rg - ((int)*(undefined8 *)(*(long *)&cr_local[1].apos + 0x20) +
                           *(int *)(aux + 0x3c));
            *(long *)(*(long *)&cr_local[1].apos + 0x30) =
                 (long)rg - *(long *)(*(long *)&cr_local[1].apos + 0x20);
            if (*(ulong *)(*(long *)&cr_local[1].apos + 0x30) <=
                *(ulong *)(*(long *)&cr_local[1].apos + 0x28)) {
              return pcStack_58;
            }
            __assert_fail("s->aux_blk->byte <= s->aux_blk->alloc",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_encode.c"
                          ,0x90a,
                          "char *cram_encode_aux(cram_fd *, bam_seq_t *, cram_container *, cram_slice *, cram_record *)"
                         );
          }
          if (((*orig != 'R') || (orig[1] != 'G')) || (orig[2] != 'Z')) break;
          pcStack_58 = orig + 3;
          do {
            pcVar23 = orig + 1;
            cVar4 = *orig;
            orig = pcVar23;
          } while (cVar4 != '\0');
        }
        if (((*orig != 'M') || (orig[1] != 'D')) || (orig[2] != 'Z')) break;
        do {
          pcVar23 = orig + 1;
          cVar4 = *orig;
          orig = pcVar23;
        } while (cVar4 != '\0');
      }
      if ((*orig != 'N') || (orig[1] != 'M')) break;
      cVar4 = orig[2];
      if ((cVar4 == 'A') || (cVar4 == 'C')) {
LAB_0017365f:
        orig = orig + 4;
      }
      else if (cVar4 == 'I') {
LAB_0017367b:
        orig = orig + 7;
      }
      else {
        if (cVar4 != 'S') {
          if (cVar4 == 'c') goto LAB_0017365f;
          if ((cVar4 == 'f') || (cVar4 == 'i')) goto LAB_0017367b;
          if (cVar4 != 's') {
            fprintf(_stderr,"Unhandled type code for NM tag\n");
            return (char *)0x0;
          }
        }
        orig = orig + 5;
      }
    }
    while (_new->alloc <= _new->byte + 3) {
      if (_new->alloc == 0) {
        local_100 = 1024.0;
      }
      else {
        sVar3 = _new->alloc;
        auVar28._8_4_ = (int)(sVar3 >> 0x20);
        auVar28._0_8_ = sVar3;
        auVar28._12_4_ = 0x45300000;
        local_100 = ((auVar28._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) * 1.5;
      }
      _new->alloc = (long)local_100 |
                    (long)(local_100 - 9.223372036854776e+18) & (long)local_100 >> 0x3f;
      puVar22 = (uchar *)realloc(_new->data,_new->alloc);
      _new->data = puVar22;
    }
    puVar22 = _new->data;
    sVar3 = _new->byte;
    *(undefined2 *)(puVar22 + sVar3) = *(undefined2 *)orig;
    puVar22[sVar3 + 2] = orig[2];
    _new->byte = _new->byte + 3;
    local_80 = (int)*orig << 0x10 | (int)orig[1] << 8 | (int)orig[2];
    kh_put_s_i2i(*(kh_s_i2i_t **)&s_local[2].cigar_alloc,local_80,(int *)((long)&tmp_1 + 4));
    if (tmp_1._4_4_ == -1) {
      return (char *)0x0;
    }
    if (((*orig != 'B') || (orig[1] != 'Q')) || (orig[2] != 'Z')) {
      if (((*orig == 'B') && (orig[1] == 'D')) && (orig[2] == 'Z')) {
        lVar6._0_4_ = cr_local[1].mate_pos;
        lVar6._4_4_ = cr_local[1].tlen;
        if (lVar6 == 0) {
          pcVar20 = cram_new_block(EXTERNAL,4);
          *(cram_block **)&cr_local[1].mate_pos = pcVar20;
          if (pcVar20 == (cram_block *)0x0) {
            return (char *)0x0;
          }
        }
        while( true ) {
          uVar1 = *(undefined8 *)(*(long *)&cr_local[1].mate_pos + 0x28);
          auVar48._8_4_ = (int)((ulong)uVar1 >> 0x20);
          auVar48._0_8_ = uVar1;
          auVar48._12_4_ = 0x45300000;
          uVar2 = *(undefined8 *)(*(long *)&cr_local[1].mate_pos + 0x30);
          auVar31._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar31._0_8_ = uVar2;
          auVar31._12_4_ = 0x45300000;
          if ((auVar31._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0) +
              (double)td_b._4_4_ * 1.34 + 1.0 <
              (auVar48._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) break;
          if (*(long *)(*(long *)&cr_local[1].mate_pos + 0x28) == 0) {
            local_110 = 1024.0;
          }
          else {
            uVar1 = *(undefined8 *)(*(long *)&cr_local[1].mate_pos + 0x28);
            auVar32._8_4_ = (int)((ulong)uVar1 >> 0x20);
            auVar32._0_8_ = uVar1;
            auVar32._12_4_ = 0x45300000;
            local_110 = ((auVar32._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
          }
          *(long *)(*(long *)&cr_local[1].mate_pos + 0x28) =
               (long)local_110 | (long)(local_110 - 9.223372036854776e+18) & (long)local_110 >> 0x3f
          ;
          pvVar19 = realloc(*(void **)(*(long *)&cr_local[1].mate_pos + 0x20),
                            *(size_t *)(*(long *)&cr_local[1].mate_pos + 0x28));
          *(void **)(*(long *)&cr_local[1].mate_pos + 0x20) = pvVar19;
        }
        pcVar23 = (char *)(*(long *)(*(long *)&cr_local[1].mate_pos + 0x20) +
                          *(long *)(*(long *)&cr_local[1].mate_pos + 0x30));
        orig = orig + 3;
        do {
          tmp_3 = pcVar23;
          pcVar24 = orig + 1;
          cVar4 = *orig;
          *tmp_3 = cVar4;
          pcVar23 = tmp_3 + 1;
          orig = pcVar24;
        } while (cVar4 != '\0');
        tmp_3[1] = '\t';
        *(char **)(*(long *)&cr_local[1].mate_pos + 0x30) =
             tmp_3 + (2 - *(long *)(*(long *)&cr_local[1].mate_pos + 0x20));
      }
      else if (((*orig == 'B') && (orig[1] == 'I')) && (orig[2] == 'Z')) {
        lVar7._0_4_ = cr_local[1].ntags;
        lVar7._4_4_ = cr_local[1].aux;
        if (lVar7 == 0) {
          pcVar20 = cram_new_block(EXTERNAL,5);
          *(cram_block **)&cr_local[1].ntags = pcVar20;
          if (pcVar20 == (cram_block *)0x0) {
            return (char *)0x0;
          }
        }
        while( true ) {
          uVar1 = *(undefined8 *)(*(long *)&cr_local[1].ntags + 0x28);
          auVar49._8_4_ = (int)((ulong)uVar1 >> 0x20);
          auVar49._0_8_ = uVar1;
          auVar49._12_4_ = 0x45300000;
          uVar2 = *(undefined8 *)(*(long *)&cr_local[1].ntags + 0x30);
          auVar33._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar33._0_8_ = uVar2;
          auVar33._12_4_ = 0x45300000;
          if ((auVar33._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0) +
              (double)td_b._4_4_ * 1.34 + 1.0 <
              (auVar49._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) break;
          if (*(long *)(*(long *)&cr_local[1].ntags + 0x28) == 0) {
            local_118 = 1024.0;
          }
          else {
            uVar1 = *(undefined8 *)(*(long *)&cr_local[1].ntags + 0x28);
            auVar34._8_4_ = (int)((ulong)uVar1 >> 0x20);
            auVar34._0_8_ = uVar1;
            auVar34._12_4_ = 0x45300000;
            local_118 = ((auVar34._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
          }
          *(long *)(*(long *)&cr_local[1].ntags + 0x28) =
               (long)local_118 | (long)(local_118 - 9.223372036854776e+18) & (long)local_118 >> 0x3f
          ;
          pvVar19 = realloc(*(void **)(*(long *)&cr_local[1].ntags + 0x20),
                            *(size_t *)(*(long *)&cr_local[1].ntags + 0x28));
          *(void **)(*(long *)&cr_local[1].ntags + 0x20) = pvVar19;
        }
        pcVar23 = (char *)(*(long *)(*(long *)&cr_local[1].ntags + 0x20) +
                          *(long *)(*(long *)&cr_local[1].ntags + 0x30));
        orig = orig + 3;
        do {
          tmp_4 = pcVar23;
          pcVar24 = orig + 1;
          cVar4 = *orig;
          *tmp_4 = cVar4;
          pcVar23 = tmp_4 + 1;
          orig = pcVar24;
        } while (cVar4 != '\0');
        tmp_4[1] = '\t';
        *(char **)(*(long *)&cr_local[1].ntags + 0x30) =
             tmp_4 + (2 - *(long *)(*(long *)&cr_local[1].ntags + 0x20));
      }
      else if (((*orig == 'O') && (orig[1] == 'Q')) && (orig[2] == 'Z')) {
        lVar8._0_4_ = cr_local[1].name;
        lVar8._4_4_ = cr_local[1].name_len;
        if (lVar8 == 0) {
          pcVar20 = cram_new_block(EXTERNAL,2);
          *(cram_block **)&cr_local[1].name = pcVar20;
          if (pcVar20 == (cram_block *)0x0) {
            return (char *)0x0;
          }
        }
        while( true ) {
          uVar1 = *(undefined8 *)(*(long *)&cr_local[1].name + 0x28);
          auVar50._8_4_ = (int)((ulong)uVar1 >> 0x20);
          auVar50._0_8_ = uVar1;
          auVar50._12_4_ = 0x45300000;
          uVar2 = *(undefined8 *)(*(long *)&cr_local[1].name + 0x30);
          auVar35._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar35._0_8_ = uVar2;
          auVar35._12_4_ = 0x45300000;
          if ((auVar35._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0) +
              (double)td_b._4_4_ * 1.34 + 1.0 <
              (auVar50._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) break;
          if (*(long *)(*(long *)&cr_local[1].name + 0x28) == 0) {
            local_120 = 1024.0;
          }
          else {
            uVar1 = *(undefined8 *)(*(long *)&cr_local[1].name + 0x28);
            auVar36._8_4_ = (int)((ulong)uVar1 >> 0x20);
            auVar36._0_8_ = uVar1;
            auVar36._12_4_ = 0x45300000;
            local_120 = ((auVar36._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
          }
          *(long *)(*(long *)&cr_local[1].name + 0x28) =
               (long)local_120 | (long)(local_120 - 9.223372036854776e+18) & (long)local_120 >> 0x3f
          ;
          pvVar19 = realloc(*(void **)(*(long *)&cr_local[1].name + 0x20),
                            *(size_t *)(*(long *)&cr_local[1].name + 0x28));
          *(void **)(*(long *)&cr_local[1].name + 0x20) = pvVar19;
        }
        pcVar23 = (char *)(*(long *)(*(long *)&cr_local[1].name + 0x20) +
                          *(long *)(*(long *)&cr_local[1].name + 0x30));
        orig = orig + 3;
        do {
          _blen = pcVar23;
          pcVar24 = orig + 1;
          cVar4 = *orig;
          *_blen = cVar4;
          pcVar23 = _blen + 1;
          orig = pcVar24;
        } while (cVar4 != '\0');
        _blen[1] = '\t';
        *(char **)(*(long *)&cr_local[1].name + 0x30) =
             _blen + (2 - *(long *)(*(long *)&cr_local[1].name + 0x20));
      }
      else if ((((*orig == 'F') && (orig[1] == 'Z')) && (orig[2] == 'B')) ||
              (((*orig == 'Z' && (orig[1] == 'M')) && (orig[2] == 'B')))) {
        uVar18 = (uint)orig[3];
        local_b0 = (uint)(byte)orig[4] + (uint)(byte)orig[5] * 0x100 + (uint)(byte)orig[6] * 0x10000
                   + (uint)(byte)orig[7] * 0x1000000;
        lVar9._0_4_ = cr_local[1].aux_size;
        lVar9._4_4_ = cr_local[1].TN_idx;
        if (lVar9 == 0) {
          pcVar20 = cram_new_block(EXTERNAL,6);
          *(cram_block **)&cr_local[1].aux_size = pcVar20;
          if (pcVar20 == (cram_block *)0x0) {
            return (char *)0x0;
          }
        }
        while( true ) {
          uVar1 = *(undefined8 *)(*(long *)&cr_local[1].aux_size + 0x28);
          auVar51._8_4_ = (int)((ulong)uVar1 >> 0x20);
          auVar51._0_8_ = uVar1;
          auVar51._12_4_ = 0x45300000;
          uVar2 = *(undefined8 *)(*(long *)&cr_local[1].aux_size + 0x30);
          auVar37._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar37._0_8_ = uVar2;
          auVar37._12_4_ = 0x45300000;
          if ((auVar37._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0) +
              (double)td_b._4_4_ * 1.34 + 1.0 <
              (auVar51._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) break;
          if (*(long *)(*(long *)&cr_local[1].aux_size + 0x28) == 0) {
            local_128 = 1024.0;
          }
          else {
            uVar1 = *(undefined8 *)(*(long *)&cr_local[1].aux_size + 0x28);
            auVar38._8_4_ = (int)((ulong)uVar1 >> 0x20);
            auVar38._0_8_ = uVar1;
            auVar38._12_4_ = 0x45300000;
            local_128 = ((auVar38._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
          }
          *(long *)(*(long *)&cr_local[1].aux_size + 0x28) =
               (long)local_128 | (long)(local_128 - 9.223372036854776e+18) & (long)local_128 >> 0x3f
          ;
          pvVar19 = realloc(*(void **)(*(long *)&cr_local[1].aux_size + 0x20),
                            *(size_t *)(*(long *)&cr_local[1].aux_size + 0x28));
          *(void **)(*(long *)&cr_local[1].aux_size + 0x20) = pvVar19;
        }
        pbVar21 = (byte *)(*(long *)(*(long *)&cr_local[1].aux_size + 0x20) +
                          *(long *)(*(long *)&cr_local[1].aux_size + 0x30));
        orig = orig + 3;
        if (uVar18 != 0x43) {
          if (uVar18 == 0x49) {
LAB_001744b7:
            local_b0 = local_b0 * 4;
          }
          else {
            if (uVar18 != 0x53) {
              if (uVar18 == 99) goto LAB_001744f3;
              if ((uVar18 == 0x66) || (uVar18 == 0x69)) goto LAB_001744b7;
              if (uVar18 != 0x73) {
                fprintf(_stderr,"Unknown sub-type \'%c\' for aux type \'B\'\n",(ulong)uVar18);
                return (char *)0x0;
              }
            }
            local_b0 = local_b0 * 2;
          }
        }
LAB_001744f3:
        uVar18 = local_b0 + 5;
        bVar17 = (byte)uVar18;
        if ((uVar18 & 0xffffff80) == 0) {
          *pbVar21 = bVar17;
          local_130 = 1;
        }
        else {
          bVar14 = (byte)(uVar18 >> 8);
          if ((uVar18 & 0xffffc000) == 0) {
            *pbVar21 = bVar14 | 0x80;
            pbVar21[1] = bVar17;
            local_134 = 2;
          }
          else {
            bVar15 = (byte)(uVar18 >> 0x10);
            if ((uVar18 & 0xffe00000) == 0) {
              *pbVar21 = bVar15 | 0xc0;
              pbVar21[1] = bVar14;
              pbVar21[2] = bVar17;
              local_138 = 3;
            }
            else {
              bVar16 = (byte)(uVar18 >> 0x18);
              if ((uVar18 & 0xf0000000) == 0) {
                *pbVar21 = bVar16 | 0xe0;
                pbVar21[1] = bVar15;
                pbVar21[2] = bVar14;
                pbVar21[3] = bVar17;
                local_13c = 4;
              }
              else {
                *pbVar21 = (char)bVar16 >> 4 | 0xf0;
                pbVar21[1] = (byte)((int)uVar18 >> 0x14);
                pbVar21[2] = (byte)((int)uVar18 >> 0xc);
                pbVar21[3] = (byte)((int)uVar18 >> 4);
                pbVar21[4] = bVar17 & 0xf;
                local_13c = 5;
              }
              local_138 = local_13c;
            }
            local_134 = local_138;
          }
          local_130 = local_134;
        }
        memcpy(pbVar21 + local_130,orig,(long)(int)uVar18);
        *(byte **)(*(long *)&cr_local[1].aux_size + 0x30) =
             pbVar21 + local_130 +
             ((long)(int)uVar18 - *(long *)(*(long *)&cr_local[1].aux_size + 0x20));
        orig = orig + (int)uVar18;
      }
      else if ((((((*orig == 'Q') && (orig[1] == '2')) || ((*orig == 'U' && (orig[1] == '2')))) ||
                ((*orig == 'Q' && (orig[1] == 'T')))) || ((*orig == 'C' && (orig[1] == 'Q')))) &&
              (orig[2] == 'Z')) {
        lVar10._0_4_ = cr_local[1].TL;
        lVar10._4_4_ = cr_local[1].seq;
        if (lVar10 == 0) {
          pcVar20 = cram_new_block(EXTERNAL,7);
          *(cram_block **)&cr_local[1].TL = pcVar20;
          if (pcVar20 == (cram_block *)0x0) {
            return (char *)0x0;
          }
        }
        while( true ) {
          uVar1 = *(undefined8 *)(*(long *)&cr_local[1].TL + 0x28);
          auVar52._8_4_ = (int)((ulong)uVar1 >> 0x20);
          auVar52._0_8_ = uVar1;
          auVar52._12_4_ = 0x45300000;
          uVar2 = *(undefined8 *)(*(long *)&cr_local[1].TL + 0x30);
          auVar39._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar39._0_8_ = uVar2;
          auVar39._12_4_ = 0x45300000;
          if ((auVar39._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0) +
              (double)td_b._4_4_ * 1.34 + 1.0 <
              (auVar52._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) break;
          if (*(long *)(*(long *)&cr_local[1].TL + 0x28) == 0) {
            local_148 = 1024.0;
          }
          else {
            uVar1 = *(undefined8 *)(*(long *)&cr_local[1].TL + 0x28);
            auVar40._8_4_ = (int)((ulong)uVar1 >> 0x20);
            auVar40._0_8_ = uVar1;
            auVar40._12_4_ = 0x45300000;
            local_148 = ((auVar40._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
          }
          *(long *)(*(long *)&cr_local[1].TL + 0x28) =
               (long)local_148 | (long)(local_148 - 9.223372036854776e+18) & (long)local_148 >> 0x3f
          ;
          pvVar19 = realloc(*(void **)(*(long *)&cr_local[1].TL + 0x20),
                            *(size_t *)(*(long *)&cr_local[1].TL + 0x28));
          *(void **)(*(long *)&cr_local[1].TL + 0x20) = pvVar19;
        }
        pcVar23 = (char *)(*(long *)(*(long *)&cr_local[1].TL + 0x20) +
                          *(long *)(*(long *)&cr_local[1].TL + 0x30));
        orig = orig + 3;
        do {
          tmp_7 = pcVar23;
          pcVar24 = orig + 1;
          cVar4 = *orig;
          *tmp_7 = cVar4;
          pcVar23 = tmp_7 + 1;
          orig = pcVar24;
        } while (cVar4 != '\0');
        tmp_7[1] = '\t';
        *(char **)(*(long *)&cr_local[1].TL + 0x30) =
             tmp_7 + (2 - *(long *)(*(long *)&cr_local[1].TL + 0x20));
      }
      else if ((((((*orig == 'R') && (orig[1] == '2')) || ((*orig == 'E' && (orig[1] == '2')))) ||
                (((*orig == 'C' && (orig[1] == 'S')) || ((*orig == 'B' && (orig[1] == 'C')))))) ||
               ((*orig == 'R' && (orig[1] == 'T')))) && (orig[2] == 'Z')) {
        lVar11._0_4_ = cr_local[1].qual;
        lVar11._4_4_ = cr_local[1].cigar;
        if (lVar11 == 0) {
          pcVar20 = cram_new_block(EXTERNAL,8);
          *(cram_block **)&cr_local[1].qual = pcVar20;
          if (pcVar20 == (cram_block *)0x0) {
            return (char *)0x0;
          }
        }
        while( true ) {
          uVar1 = *(undefined8 *)(*(long *)&cr_local[1].qual + 0x28);
          auVar53._8_4_ = (int)((ulong)uVar1 >> 0x20);
          auVar53._0_8_ = uVar1;
          auVar53._12_4_ = 0x45300000;
          uVar2 = *(undefined8 *)(*(long *)&cr_local[1].qual + 0x30);
          auVar41._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar41._0_8_ = uVar2;
          auVar41._12_4_ = 0x45300000;
          if ((auVar41._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0) +
              (double)td_b._4_4_ * 1.34 + 1.0 <
              (auVar53._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) break;
          if (*(long *)(*(long *)&cr_local[1].qual + 0x28) == 0) {
            local_150 = 1024.0;
          }
          else {
            uVar1 = *(undefined8 *)(*(long *)&cr_local[1].qual + 0x28);
            auVar42._8_4_ = (int)((ulong)uVar1 >> 0x20);
            auVar42._0_8_ = uVar1;
            auVar42._12_4_ = 0x45300000;
            local_150 = ((auVar42._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
          }
          *(long *)(*(long *)&cr_local[1].qual + 0x28) =
               (long)local_150 | (long)(local_150 - 9.223372036854776e+18) & (long)local_150 >> 0x3f
          ;
          pvVar19 = realloc(*(void **)(*(long *)&cr_local[1].qual + 0x20),
                            *(size_t *)(*(long *)&cr_local[1].qual + 0x28));
          *(void **)(*(long *)&cr_local[1].qual + 0x20) = pvVar19;
        }
        pcVar23 = (char *)(*(long *)(*(long *)&cr_local[1].qual + 0x20) +
                          *(long *)(*(long *)&cr_local[1].qual + 0x30));
        orig = orig + 3;
        do {
          tmp_8 = pcVar23;
          pcVar24 = orig + 1;
          cVar4 = *orig;
          *tmp_8 = cVar4;
          pcVar23 = tmp_8 + 1;
          orig = pcVar24;
        } while (cVar4 != '\0');
        tmp_8[1] = '\t';
        *(char **)(*(long *)&cr_local[1].qual + 0x30) =
             tmp_8 + (2 - *(long *)(*(long *)&cr_local[1].qual + 0x20));
      }
      else {
        switch(orig[2]) {
        case 'A':
        case 'C':
        case 'c':
          *rg = orig[3];
          rg = rg + 1;
          orig = orig + 4;
          break;
        case 'B':
          uVar18 = (uint)orig[3];
          local_e0 = *(int *)(orig + 4);
          orig = orig + 3;
          if (uVar18 != 0x43) {
            if (uVar18 == 0x49) {
LAB_00175297:
              local_e0 = local_e0 << 2;
            }
            else {
              if (uVar18 != 0x53) {
                if (uVar18 == 99) goto LAB_001752d3;
                if ((uVar18 == 0x66) || (uVar18 == 0x69)) goto LAB_00175297;
                if (uVar18 != 0x73) {
                  fprintf(_stderr,"Unknown sub-type \'%c\' for aux type \'B\'\n",(ulong)uVar18);
                  return (char *)0x0;
                }
              }
              local_e0 = local_e0 << 1;
            }
          }
LAB_001752d3:
          uVar18 = local_e0 + 5;
          bVar17 = (byte)uVar18;
          if ((uVar18 & 0xffffff80) == 0) {
            *rg = bVar17;
            local_168 = 1;
          }
          else {
            bVar14 = (byte)(uVar18 >> 8);
            if ((uVar18 & 0xffffc000) == 0) {
              *rg = bVar14 | 0x80;
              rg[1] = bVar17;
              local_16c = 2;
            }
            else {
              bVar15 = (byte)(uVar18 >> 0x10);
              if ((uVar18 & 0xffe00000) == 0) {
                *rg = bVar15 | 0xc0;
                rg[1] = bVar14;
                rg[2] = bVar17;
                local_170 = 3;
              }
              else {
                bVar16 = (byte)(uVar18 >> 0x18);
                if ((uVar18 & 0xf0000000) == 0) {
                  *rg = bVar16 | 0xe0;
                  rg[1] = bVar15;
                  rg[2] = bVar14;
                  rg[3] = bVar17;
                  local_174 = 4;
                }
                else {
                  *rg = (char)bVar16 >> 4 | 0xf0;
                  rg[1] = (char)((int)uVar18 >> 0x14);
                  rg[2] = (char)((int)uVar18 >> 0xc);
                  rg[3] = (char)((int)uVar18 >> 4);
                  rg[4] = bVar17 & 0xf;
                  local_174 = 5;
                }
                local_170 = local_174;
              }
              local_16c = local_170;
            }
            local_168 = local_16c;
          }
          rg = rg + local_168;
          memcpy(rg,orig,(long)(int)uVar18);
          rg = rg + (int)uVar18;
          orig = orig + (int)uVar18;
          break;
        default:
          fprintf(_stderr,"Unknown aux type \'%c\'\n",(ulong)(uint)(int)orig[2]);
          return (char *)0x0;
        case 'H':
        case 'Z':
          lVar12._0_4_ = cr_local[1].ncigar;
          lVar12._4_4_ = cr_local[1].aend;
          if (lVar12 == 0) {
            pcVar20 = cram_new_block(EXTERNAL,9);
            *(cram_block **)&cr_local[1].ncigar = pcVar20;
            if (pcVar20 == (cram_block *)0x0) {
              return (char *)0x0;
            }
          }
          while( true ) {
            uVar1 = *(undefined8 *)(*(long *)&cr_local[1].ncigar + 0x28);
            auVar54._8_4_ = (int)((ulong)uVar1 >> 0x20);
            auVar54._0_8_ = uVar1;
            auVar54._12_4_ = 0x45300000;
            uVar2 = *(undefined8 *)(*(long *)&cr_local[1].ncigar + 0x30);
            auVar43._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar43._0_8_ = uVar2;
            auVar43._12_4_ = 0x45300000;
            if ((auVar43._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0) +
                (double)td_b._4_4_ * 1.34 + 1.0 <
                (auVar54._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) break;
            if (*(long *)(*(long *)&cr_local[1].ncigar + 0x28) == 0) {
              local_160 = 1024.0;
            }
            else {
              uVar1 = *(undefined8 *)(*(long *)&cr_local[1].ncigar + 0x28);
              auVar44._8_4_ = (int)((ulong)uVar1 >> 0x20);
              auVar44._0_8_ = uVar1;
              auVar44._12_4_ = 0x45300000;
              local_160 = ((auVar44._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
            }
            *(long *)(*(long *)&cr_local[1].ncigar + 0x28) =
                 (long)local_160 |
                 (long)(local_160 - 9.223372036854776e+18) & (long)local_160 >> 0x3f;
            pvVar19 = realloc(*(void **)(*(long *)&cr_local[1].ncigar + 0x20),
                              *(size_t *)(*(long *)&cr_local[1].ncigar + 0x28));
            *(void **)(*(long *)&cr_local[1].ncigar + 0x20) = pvVar19;
          }
          pcVar23 = (char *)(*(long *)(*(long *)&cr_local[1].ncigar + 0x20) +
                            *(long *)(*(long *)&cr_local[1].ncigar + 0x30));
          orig = orig + 3;
          do {
            _blen_1 = pcVar23;
            pcVar24 = orig + 1;
            cVar4 = *orig;
            *_blen_1 = cVar4;
            pcVar23 = _blen_1 + 1;
            orig = pcVar24;
          } while (cVar4 != '\0');
          _blen_1[1] = '\t';
          *(char **)(*(long *)&cr_local[1].ncigar + 0x30) =
               _blen_1 + (2 - *(long *)(*(long *)&cr_local[1].ncigar + 0x20));
          break;
        case 'I':
        case 'f':
        case 'i':
          *rg = orig[3];
          rg[1] = orig[4];
          rg[2] = orig[5];
          rg[3] = orig[6];
          rg = rg + 4;
          orig = orig + 7;
          break;
        case 'S':
        case 's':
          *rg = orig[3];
          rg[1] = orig[4];
          rg = rg + 2;
          orig = orig + 5;
          break;
        case 'd':
          *rg = orig[3];
          rg[1] = orig[4];
          rg[2] = orig[5];
          rg[3] = orig[6];
          rg[4] = orig[7];
          rg[5] = orig[8];
          rg[6] = orig[9];
          rg[7] = orig[10];
          rg = rg + 8;
          orig = orig + 0xb;
        }
      }
      goto LAB_00173500;
    }
    lVar5._0_4_ = cr_local[1].mate_line;
    lVar5._4_4_ = cr_local[1].mate_ref_id;
    if (lVar5 == 0) {
      pcVar20 = cram_new_block(EXTERNAL,3);
      *(cram_block **)&cr_local[1].mate_line = pcVar20;
      if (pcVar20 == (cram_block *)0x0) {
        return (char *)0x0;
      }
    }
    while( true ) {
      uVar1 = *(undefined8 *)(*(long *)&cr_local[1].mate_line + 0x28);
      auVar47._8_4_ = (int)((ulong)uVar1 >> 0x20);
      auVar47._0_8_ = uVar1;
      auVar47._12_4_ = 0x45300000;
      uVar2 = *(undefined8 *)(*(long *)&cr_local[1].mate_line + 0x30);
      auVar29._8_4_ = (int)((ulong)uVar2 >> 0x20);
      auVar29._0_8_ = uVar2;
      auVar29._12_4_ = 0x45300000;
      if ((auVar29._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0) +
          (double)td_b._4_4_ * 1.34 + 1.0 <
          (auVar47._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) break;
      if (*(long *)(*(long *)&cr_local[1].mate_line + 0x28) == 0) {
        local_108 = 1024.0;
      }
      else {
        uVar1 = *(undefined8 *)(*(long *)&cr_local[1].mate_line + 0x28);
        auVar30._8_4_ = (int)((ulong)uVar1 >> 0x20);
        auVar30._0_8_ = uVar1;
        auVar30._12_4_ = 0x45300000;
        local_108 = ((auVar30._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
      }
      *(long *)(*(long *)&cr_local[1].mate_line + 0x28) =
           (long)local_108 | (long)(local_108 - 9.223372036854776e+18) & (long)local_108 >> 0x3f;
      pvVar19 = realloc(*(void **)(*(long *)&cr_local[1].mate_line + 0x20),
                        *(size_t *)(*(long *)&cr_local[1].mate_line + 0x28));
      *(void **)(*(long *)&cr_local[1].mate_line + 0x20) = pvVar19;
    }
    pcVar23 = (char *)(*(long *)(*(long *)&cr_local[1].mate_line + 0x20) +
                      *(long *)(*(long *)&cr_local[1].mate_line + 0x30));
    orig = orig + 3;
    do {
      tmp_2 = pcVar23;
      pcVar24 = orig + 1;
      cVar4 = *orig;
      *tmp_2 = cVar4;
      pcVar23 = tmp_2 + 1;
      orig = pcVar24;
    } while (cVar4 != '\0');
    tmp_2[1] = '\t';
    *(char **)(*(long *)&cr_local[1].mate_line + 0x30) =
         tmp_2 + (2 - *(long *)(*(long *)&cr_local[1].mate_line + 0x20));
  } while( true );
}

Assistant:

static char *cram_encode_aux(cram_fd *fd, bam_seq_t *b, cram_container *c,
			     cram_slice *s, cram_record *cr) {
    char *aux, *orig, *tmp, *rg = NULL;
    int aux_size = bam_get_l_aux(b);
    cram_block *td_b = c->comp_hdr->TD_blk;
    int TD_blk_size = BLOCK_SIZE(td_b), new;
    char *key;
    khint_t k;


    /* Worst case is 1 nul char on every ??:Z: string, so +33% */
    BLOCK_GROW(s->aux_blk, aux_size*1.34+1);
    tmp = (char *)BLOCK_END(s->aux_blk);


    orig = aux = (char *)bam_aux(b);

    // Copy aux keys to td_b and aux values to s->aux_blk
    while (aux - orig < aux_size && aux[0] != 0) {
	uint32_t i32;
	int r;

	if (aux[0] == 'R' && aux[1] == 'G' && aux[2] == 'Z') {
	    rg = &aux[3];
	    while (*aux++);
	    continue;
	}
	if (aux[0] == 'M' && aux[1] == 'D' && aux[2] == 'Z') {
	    while (*aux++);
	    continue;
	}
	if (aux[0] == 'N' && aux[1] == 'M') {
	    switch(aux[2]) {
	    case 'A': case 'C': case 'c': aux+=4; break;
	    case 'S': case 's':           aux+=5; break;
	    case 'I': case 'i': case 'f': aux+=7; break;
	    default:
		fprintf(stderr, "Unhandled type code for NM tag\n");
		return NULL;
	    }
	    continue;
	}

	BLOCK_APPEND(td_b, aux, 3);

	i32 = (aux[0]<<16) | (aux[1]<<8) | aux[2];
	kh_put(s_i2i, c->tags_used, i32, &r);
	if (-1 == r)
	    return NULL;

	// BQ:Z
	if (aux[0] == 'B' && aux[1] == 'Q' && aux[2] == 'Z') {
	    char *tmp;
	    if (!s->aux_BQ_blk)
		if (!(s->aux_BQ_blk = cram_new_block(EXTERNAL, DS_aux_BQ)))
		    return NULL;
	    BLOCK_GROW(s->aux_BQ_blk, aux_size*1.34+1);
	    tmp = (char *)BLOCK_END(s->aux_BQ_blk);
	    aux += 3;
	    while ((*tmp++=*aux++));
	    *tmp++ = '\t';
	    BLOCK_SIZE(s->aux_BQ_blk) = (uc *)tmp - BLOCK_DATA(s->aux_BQ_blk);
	    continue;
	}

	// BD:Z
	if (aux[0] == 'B' && aux[1]=='D' && aux[2] == 'Z') {
	    char *tmp;
	    if (!s->aux_BD_blk)
		if (!(s->aux_BD_blk = cram_new_block(EXTERNAL, DS_aux_BD)))
		    return NULL;
	    BLOCK_GROW(s->aux_BD_blk, aux_size*1.34+1);
	    tmp = (char *)BLOCK_END(s->aux_BD_blk);
	    aux += 3;
	    while ((*tmp++=*aux++));
	    *tmp++ = '\t';
	    BLOCK_SIZE(s->aux_BD_blk) = (uc *)tmp - BLOCK_DATA(s->aux_BD_blk);
	    continue;
	}

	// BI:Z
	if (aux[0] == 'B' && aux[1]=='I' && aux[2] == 'Z') {
	    char *tmp;
	    if (!s->aux_BI_blk)
		if (!(s->aux_BI_blk = cram_new_block(EXTERNAL, DS_aux_BI)))
		    return NULL;
	    BLOCK_GROW(s->aux_BI_blk, aux_size*1.34+1);
	    tmp = (char *)BLOCK_END(s->aux_BI_blk);
	    aux += 3;
	    while ((*tmp++=*aux++));
	    *tmp++ = '\t';
	    BLOCK_SIZE(s->aux_BI_blk) = (uc *)tmp - BLOCK_DATA(s->aux_BI_blk);
	    continue;
	}

	// OQ:Z:
	if (aux[0] == 'O' && aux[1] == 'Q' && aux[2] == 'Z') {
	    char *tmp;
	    if (!s->aux_OQ_blk)
		if (!(s->aux_OQ_blk = cram_new_block(EXTERNAL, DS_aux_OQ)))
		    return NULL;
	    BLOCK_GROW(s->aux_OQ_blk, aux_size*1.34+1);
	    tmp = (char *)BLOCK_END(s->aux_OQ_blk);
	    aux += 3;
	    while ((*tmp++=*aux++));
	    *tmp++ = '\t';
	    BLOCK_SIZE(s->aux_OQ_blk) = (uc *)tmp - BLOCK_DATA(s->aux_OQ_blk);
	    continue;
	}

	// FZ:B or ZM:B
	if ((aux[0] == 'F' && aux[1] == 'Z' && aux[2] == 'B') ||
	    (aux[0] == 'Z' && aux[1] == 'M' && aux[2] == 'B')) {
	    int type = aux[3], blen;
	    uint32_t count = (uint32_t)((((unsigned char *)aux)[4]<< 0) +
					(((unsigned char *)aux)[5]<< 8) +
					(((unsigned char *)aux)[6]<<16) +
					(((unsigned char *)aux)[7]<<24));
	    char *tmp;
	    if (!s->aux_FZ_blk)
		if (!(s->aux_FZ_blk = cram_new_block(EXTERNAL, DS_aux_FZ)))
		    return NULL;
	    BLOCK_GROW(s->aux_FZ_blk, aux_size*1.34+1);
	    tmp = (char *)BLOCK_END(s->aux_FZ_blk);

	    // skip TN field
	    aux+=3;

	    // We use BYTE_ARRAY_LEN with external length, so store that first
	    switch (type) {
	    case 'c': case 'C':
		blen = count;
		break;
	    case 's': case 'S':
		blen = 2*count;
		break;
	    case 'i': case 'I': case 'f':
		blen = 4*count;
		break;
	    default:
		fprintf(stderr, "Unknown sub-type '%c' for aux type 'B'\n",
			type);
		return NULL;
		    
	    }

	    blen += 5; // sub-type & length
	    tmp += itf8_put(tmp, blen);

	    // The tag data itself
	    memcpy(tmp, aux, blen); tmp += blen; aux += blen;

	    BLOCK_SIZE(s->aux_FZ_blk) = (uc *)tmp - BLOCK_DATA(s->aux_FZ_blk);
	    continue;
	}

	// Other quality data - {Q2,E2,U2,CQ}:Z and similar
	if (((aux[0] == 'Q' && aux[1] == '2') ||
	     (aux[0] == 'U' && aux[1] == '2') ||
	     (aux[0] == 'Q' && aux[1] == 'T') ||
	     (aux[0] == 'C' && aux[1] == 'Q')) && aux[2] == 'Z') {
	    char *tmp;
	    if (!s->aux_oq_blk)
		if (!(s->aux_oq_blk = cram_new_block(EXTERNAL, DS_aux_oq)))
		    return NULL;
	    BLOCK_GROW(s->aux_oq_blk, aux_size*1.34+1);
	    tmp = (char *)BLOCK_END(s->aux_oq_blk);
	    aux += 3;
	    while ((*tmp++=*aux++));
	    *tmp++ = '\t';
	    BLOCK_SIZE(s->aux_oq_blk) = (uc *)tmp - BLOCK_DATA(s->aux_oq_blk);
	    continue;
	}

	// Other sequence data - {R2,E2,CS,BC,RT}:Z and similar
	if (((aux[0] == 'R' && aux[1] == '2') ||
	     (aux[0] == 'E' && aux[1] == '2') ||
	     (aux[0] == 'C' && aux[1] == 'S') ||
	     (aux[0] == 'B' && aux[1] == 'C') ||
	     (aux[0] == 'R' && aux[1] == 'T')) && aux[2] == 'Z') {
	    char *tmp;
	    if (!s->aux_os_blk)
		if (!(s->aux_os_blk = cram_new_block(EXTERNAL, DS_aux_os)))
		    return NULL;
	    BLOCK_GROW(s->aux_os_blk, aux_size*1.34+1);
	    tmp = (char *)BLOCK_END(s->aux_os_blk);
	    aux += 3;
	    while ((*tmp++=*aux++));
	    *tmp++ = '\t';
	    BLOCK_SIZE(s->aux_os_blk) = (uc *)tmp - BLOCK_DATA(s->aux_os_blk);
	    continue;
	}


	switch(aux[2]) {
	case 'A': case 'C': case 'c':
	    aux+=3;
	    *tmp++=*aux++;
	    break;

	case 'S': case 's':
	    aux+=3;
	    *tmp++=*aux++; *tmp++=*aux++;
	    break;

	case 'I': case 'i': case 'f':
	    aux+=3;
	    *tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++;
	    break;

	case 'd':
	    aux+=3; //*tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++;
	    *tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++;
	    *tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++;
	    break;

	case 'Z': case 'H':
	    {
		char *tmp;
		if (!s->aux_oz_blk)
		    if (!(s->aux_oz_blk = cram_new_block(EXTERNAL, DS_aux_oz)))
			return NULL;
		BLOCK_GROW(s->aux_oz_blk, aux_size*1.34+1);
		tmp = (char *)BLOCK_END(s->aux_oz_blk);
		aux += 3;
		while ((*tmp++=*aux++));
		*tmp++ = '\t';
		BLOCK_SIZE(s->aux_oz_blk) = (uc *)tmp -
		    BLOCK_DATA(s->aux_oz_blk);
	    }
	    break;

	case 'B': {
	    int type = aux[3], blen;
	    uint32_t count = (uint32_t)((((unsigned char *)aux)[4]<< 0) +
					(((unsigned char *)aux)[5]<< 8) +
					(((unsigned char *)aux)[6]<<16) +
					(((unsigned char *)aux)[7]<<24));
	    // skip TN field
	    aux+=3;

	    // We use BYTE_ARRAY_LEN with external length, so store that first
	    switch (type) {
	    case 'c': case 'C':
		blen = count;
		break;
	    case 's': case 'S':
		blen = 2*count;
		break;
	    case 'i': case 'I': case 'f':
		blen = 4*count;
		break;
	    default:
		fprintf(stderr, "Unknown sub-type '%c' for aux type 'B'\n",
			type);
		return NULL;
		    
	    }

	    blen += 5; // sub-type & length
	    tmp += itf8_put(tmp, blen);

	    // The tag data itself
	    memcpy(tmp, aux, blen); tmp += blen; aux += blen;

	    //cram_stats_add(c->aux_B_stats, blen);
	    break;
	}
	default:
	    fprintf(stderr, "Unknown aux type '%c'\n", aux[2]);
	    return NULL;
	}
    }

    // FIXME: sort BLOCK_DATA(td_b) by char[3] triples
    
    // And and increment TD hash entry
    BLOCK_APPEND_CHAR(td_b, 0);

    // Duplicate key as BLOCK_DATA() can be realloced to a new pointer.
    key = string_ndup(c->comp_hdr->TD_keys, 
		      (char *)BLOCK_DATA(td_b) + TD_blk_size,
		      BLOCK_SIZE(td_b) - TD_blk_size);
    k = kh_put(m_s2i, c->comp_hdr->TD_hash, key, &new);
    if (new < 0) {
	return NULL;
    } else if (new == 0) {
	BLOCK_SIZE(td_b) = TD_blk_size;
    } else {
	kh_val(c->comp_hdr->TD_hash, k) = c->comp_hdr->nTL;
	c->comp_hdr->nTL++;
    }

    cr->TL = kh_val(c->comp_hdr->TD_hash, k);
    cram_stats_add(c->stats[DS_TL], cr->TL);

    cr->aux = BLOCK_SIZE(s->aux_blk);
    cr->aux_size = (uc *)tmp - (BLOCK_DATA(s->aux_blk) + cr->aux);
    BLOCK_SIZE(s->aux_blk) = (uc *)tmp - BLOCK_DATA(s->aux_blk);
    assert(s->aux_blk->byte <= s->aux_blk->alloc);

    return rg;
}